

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

uint32_t upb_Arena_DebugRefCount(upb_Arena *a)

{
  upb_ArenaInternal *ai;
  uintptr_t uVar1;
  upb_ArenaRoot uVar2;
  undefined8 local_20;
  uintptr_t tagged;
  upb_Arena *a_local;
  
  ai = upb_Arena_Internal(a);
  uVar2 = _upb_Arena_FindRoot(ai);
  local_20 = uVar2.tagged_count;
  uVar1 = _upb_Arena_RefCountFromTagged(local_20);
  return (uint32_t)uVar1;
}

Assistant:

uint32_t upb_Arena_DebugRefCount(const upb_Arena* a) {
  uintptr_t tagged = _upb_Arena_FindRoot(upb_Arena_Internal(a)).tagged_count;
  return (uint32_t)_upb_Arena_RefCountFromTagged(tagged);
}